

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

void deqp::gls::ShaderExecUtil::BufferIoExecutor::copyFromBuffer
               (VarType *varType,VarLayout *layout,int numValues,void *srcBasePtr,void *dstBasePtr)

{
  DataType dataType;
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  InternalError *this;
  int iVar5;
  int vecNdx;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  allocator<char> local_75;
  int local_74;
  int local_70;
  int local_6c;
  size_t local_68;
  void *local_60;
  void *local_58;
  string local_50;
  
  local_60 = srcBasePtr;
  local_58 = dstBasePtr;
  if (varType->m_type == TYPE_BASIC) {
    dataType = (varType->m_data).basic.type;
    bVar8 = 8 < dataType - TYPE_FLOAT_MAT2;
    bVar9 = 8 < dataType - TYPE_DOUBLE_MAT2;
    iVar2 = glu::getDataTypeScalarSize(dataType);
    if (bVar9 && bVar8) {
      uVar3 = 1;
    }
    else {
      uVar3 = glu::getDataTypeMatrixNumColumns(dataType);
    }
    uVar1 = uVar3;
    if ((int)uVar3 < 1) {
      uVar1 = 0;
    }
    local_68 = (long)(iVar2 / (int)uVar3) * 4;
    if (numValues < 1) {
      numValues = 0;
    }
    local_74 = iVar2 << 2;
    iVar4 = 0;
    local_70 = numValues;
    for (iVar7 = 0; iVar7 != local_70; iVar7 = iVar7 + 1) {
      local_6c = iVar4;
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        iVar5 = layout->matrixStride * (int)uVar6;
        if (bVar9 && bVar8) {
          iVar5 = 0;
        }
        memcpy((void *)((long)local_58 + (long)iVar4),
               (void *)((long)(int)(iVar5 + layout->stride * iVar7 + layout->offset) +
                       (long)local_60),local_68);
        iVar4 = iVar4 + (iVar2 / (int)uVar3) * 4;
      }
      iVar4 = local_6c + local_74;
    }
    return;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Unsupported type",&local_75);
  tcu::InternalError::InternalError(this,&local_50);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BufferIoExecutor::copyFromBuffer (const glu::VarType& varType, const VarLayout& layout, int numValues, const void* srcBasePtr, void* dstBasePtr)
{
	if (varType.isBasicType())
	{
		const glu::DataType		basicType		= varType.getBasicType();
		const bool				isMatrix		= glu::isDataTypeMatrix(basicType);
		const int				scalarSize		= glu::getDataTypeScalarSize(basicType);
		const int				numVecs			= isMatrix ? glu::getDataTypeMatrixNumColumns(basicType) : 1;
		const int				numComps		= scalarSize / numVecs;

		for (int elemNdx = 0; elemNdx < numValues; elemNdx++)
		{
			for (int vecNdx = 0; vecNdx < numVecs; vecNdx++)
			{
				const int		srcOffset		= layout.offset + layout.stride*elemNdx + (isMatrix ? layout.matrixStride*vecNdx : 0);
				const int		dstOffset		= (int)sizeof(deUint32)*(elemNdx*scalarSize + vecNdx*numComps);
				const deUint8*	srcPtr			= (const deUint8*)srcBasePtr + srcOffset;
				deUint8*		dstPtr			= (deUint8*)dstBasePtr + dstOffset;

				deMemcpy(dstPtr, srcPtr, sizeof(deUint32)*numComps);
			}
		}
	}
	else
		throw tcu::InternalError("Unsupported type");
}